

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_scriptpubkey_csv_2of2_then_1_from_bytes
              (uchar *bytes,size_t bytes_len,uint32_t csv_blocks,uint32_t flags,uchar *bytes_out,
              size_t len,size_t *written)

{
  size_t sVar1;
  ulong uVar2;
  uchar *puVar3;
  size_t script_len;
  size_t csv_len;
  size_t len_local;
  uchar *bytes_out_local;
  uint32_t flags_local;
  uint32_t csv_blocks_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  sVar1 = scriptint_get_length((ulong)csv_blocks);
  uVar2 = sVar1 + 0x4e;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((((bytes == (uchar *)0x0) || (bytes_len != 0x42)) || (csv_blocks < 0x11)) ||
     (((0xffff < csv_blocks || (flags != 0)) ||
      ((bytes_out == (uchar *)0x0 || (written == (size_t *)0x0)))))) {
    bytes_local._4_4_ = -2;
  }
  else if (len < uVar2) {
    *written = uVar2;
    bytes_local._4_4_ = 0;
  }
  else {
    *bytes_out = 't';
    bytes_out[1] = 0x8c;
    bytes_out[2] = 'c';
    bytes_out[3] = '!';
    memcpy(bytes_out + 4,bytes,0x21);
    bytes_out[0x25] = 0xad;
    bytes_out[0x26] = 'g';
    bytes_out[0x27] = (uchar)sVar1;
    sVar1 = scriptint_to_bytes((ulong)csv_blocks,bytes_out + 0x28);
    puVar3 = bytes_out + 0x28 + sVar1;
    *puVar3 = 0xb2;
    puVar3[1] = 'u';
    puVar3[2] = 'h';
    puVar3[3] = '!';
    memcpy(puVar3 + 4,bytes + 0x21,0x21);
    puVar3[0x25] = 0xac;
    *written = uVar2;
    bytes_local._4_4_ = 0;
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_scriptpubkey_csv_2of2_then_1_from_bytes(
    const unsigned char *bytes, size_t bytes_len, uint32_t csv_blocks,
    uint32_t flags, unsigned char *bytes_out, size_t len, size_t *written)
{
    size_t csv_len = scriptint_get_length(csv_blocks);
    size_t script_len = 2 * (EC_PUBLIC_KEY_LEN + 1) + 9 + 1 + csv_len; /* 1 for push */

    if (written)
        *written = 0;

    if (!bytes || bytes_len != 2 * EC_PUBLIC_KEY_LEN ||
        csv_blocks < 17 || csv_blocks > 0xffff || flags || !bytes_out || !written)
        return WALLY_EINVAL;

    if (len < script_len) {
        *written = script_len;
        return WALLY_OK;
    }

    /* The script we create is:
     *     OP_DEPTH OP_1SUB
     *     OP_IF
     *       # The stack contains the main and and recovery signatures.
     *       # Check the main signature then fall through to check the recovery.
     *       <main_pubkey> OP_CHECKSIGVERIFY
     *     OP_ELSE
     *       # The stack contains only the recovery signature.
     *       # Check the CSV time has expired then fall though as above.
     *       <csv_blocks> OP_CHECKSEQUENCEVERIFY OP_DROP
     *     OP_ENDIF
     *     # Check the recovery signature
     *     <recovery_pubkey> OP_CHECKSIG
     */
    *bytes_out++ = OP_DEPTH;
    *bytes_out++ = OP_1SUB;
    *bytes_out++ = OP_IF;
    *bytes_out++ = EC_PUBLIC_KEY_LEN;
    memcpy(bytes_out, bytes, EC_PUBLIC_KEY_LEN);
    bytes_out += EC_PUBLIC_KEY_LEN;
    *bytes_out++ = OP_CHECKSIGVERIFY;
    *bytes_out++ = OP_ELSE;
    *bytes_out++ = csv_len & 0xff;
    bytes_out += scriptint_to_bytes(csv_blocks, bytes_out);
    *bytes_out++ = OP_CHECKSEQUENCEVERIFY;
    *bytes_out++ = OP_DROP;
    *bytes_out++ = OP_ENDIF;
    *bytes_out++ = EC_PUBLIC_KEY_LEN;
    memcpy(bytes_out, bytes + EC_PUBLIC_KEY_LEN, EC_PUBLIC_KEY_LEN);
    bytes_out += EC_PUBLIC_KEY_LEN;
    *bytes_out++ = OP_CHECKSIG;

    *written = script_len;
    return WALLY_OK;
}